

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_bpf_get_heap_layout(ma_bpf_config *pConfig,ma_bpf_heap_layout *pHeapLayout)

{
  ma_result mVar1;
  size_t sVar2;
  uint uVar3;
  bool bVar4;
  size_t bpf2HeapSizeInBytes;
  ma_bpf2_config config;
  
  if (pHeapLayout == (ma_bpf_heap_layout *)0x0) {
    __assert_fail("pHeapLayout != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/RobLoach[P]raylib-cpp/build_O2/_deps/raylib-src/src/external/miniaudio.h"
                  ,0xb92e,
                  "ma_result ma_bpf_get_heap_layout(const ma_bpf_config *, ma_bpf_heap_layout *)");
  }
  pHeapLayout->sizeInBytes = 0;
  pHeapLayout->bpf2Offset = 0;
  mVar1 = MA_INVALID_ARGS;
  if ((pConfig != (ma_bpf_config *)0x0) && ((pConfig->order & 1) == 0 && pConfig->order < 9)) {
    uVar3 = pConfig->channels >> 1;
    pHeapLayout->sizeInBytes = 0;
    pHeapLayout->bpf2Offset = 0;
    sVar2 = 0;
    while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
      config.cutoffFrequency = pConfig->cutoffFrequency;
      config.format = pConfig->format;
      config.channels = pConfig->channels;
      config._12_4_ = 0;
      config.sampleRate = pConfig->sampleRate;
      config.q = 0.707107;
      mVar1 = ma_bpf2_get_heap_size(&config,&bpf2HeapSizeInBytes);
      if (mVar1 != MA_SUCCESS) {
        return mVar1;
      }
      sVar2 = bpf2HeapSizeInBytes + pHeapLayout->sizeInBytes + 0x40;
      pHeapLayout->sizeInBytes = sVar2;
    }
    pHeapLayout->sizeInBytes = sVar2 + 7 & 0xfffffffffffffff8;
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

static ma_result ma_bpf_get_heap_layout(const ma_bpf_config* pConfig, ma_bpf_heap_layout* pHeapLayout)
{
    ma_result result;
    ma_uint32 bpf2Count;
    ma_uint32 ibpf2;

    MA_ASSERT(pHeapLayout != NULL);

    MA_ZERO_OBJECT(pHeapLayout);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    /* We must have an even number of order. */
    if ((pConfig->order & 0x1) != 0) {
        return MA_INVALID_ARGS;
    }

    bpf2Count = pConfig->channels / 2;

    pHeapLayout->sizeInBytes = 0;

    /* BPF 2 */
    pHeapLayout->bpf2Offset = pHeapLayout->sizeInBytes;
    for (ibpf2 = 0; ibpf2 < bpf2Count; ibpf2 += 1) {
        size_t bpf2HeapSizeInBytes;
        ma_bpf2_config bpf2Config = ma_bpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, 0.707107);   /* <-- The "q" parameter does not matter for the purpose of calculating the heap size. */

        result = ma_bpf2_get_heap_size(&bpf2Config, &bpf2HeapSizeInBytes);
        if (result != MA_SUCCESS) {
            return result;
        }

        pHeapLayout->sizeInBytes += sizeof(ma_bpf2) + bpf2HeapSizeInBytes;
    }

    /* Make sure allocation size is aligned. */
    pHeapLayout->sizeInBytes = ma_align_64(pHeapLayout->sizeInBytes);

    return MA_SUCCESS;
}